

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O2

void free_worm(level *lev)

{
  wseg *pwVar1;
  wseg *__ptr;
  int i;
  long lVar2;
  
  for (lVar2 = 1; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    __ptr = lev->wtails[lVar2];
    if (lev->wtails[lVar2] != (wseg *)0x0) {
      while (__ptr != (wseg *)0x0) {
        pwVar1 = __ptr->nseg;
        free(__ptr);
        __ptr = pwVar1;
      }
      lev->wtails[lVar2] = (wseg *)0x0;
      lev->wheads[lVar2] = (wseg *)0x0;
    }
  }
  return;
}

Assistant:

void free_worm(struct level *lev)
{
    int i;
    struct wseg *curr, *temp;

    /* Free the segments only.  free_monchn() will take care of the
     * monsters. */
    for (i = 1; i < MAX_NUM_WORMS; i++) {
	if (!(curr = lev->wtails[i])) continue;

	while (curr) {
	    temp = curr->nseg;
	    free(curr);		/* free the segment */
	    curr = temp;
	}
	lev->wheads[i] = lev->wtails[i] = NULL;
    }
}